

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void Serialize<DataStream,std::vector<unsigned_char,secure_allocator<unsigned_char>>,uint256>
               (DataStream *os,
               pair<std::vector<unsigned_char,_secure_allocator<unsigned_char>_>,_uint256> *item)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<DataStream>
            (os,(long)(item->first).
                      super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(item->first).
                      super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  if ((item->first).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (item->first).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)os,
               (os->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)os,
               (os->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish,&item->second,item + 1);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::pair<K, T>& item)
{
    Serialize(os, item.first);
    Serialize(os, item.second);
}